

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>,_bool>
* __thiscall
google::protobuf::Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>
::InnerMap::insert<std::__cxx11::string_const&>
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>,_bool>
           *__return_storage_ptr__,void *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  unsigned_long b;
  bool bVar1;
  Node *node;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>,_unsigned_long>
  p;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>,_unsigned_long>
  local_68;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>,_unsigned_long>
  local_48;
  
  FindHelper<std::__cxx11::string>(&local_68,this,k,(TreeIterator *)0x0);
  if (local_68.first.node_ == (Node *)0x0) {
    bVar1 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
            ::InnerMap::ResizeIfLoadIsOutOfRange((InnerMap *)this,*this + 1);
    if (bVar1) {
      FindHelper<std::__cxx11::string>(&local_48,this,k,(TreeIterator *)0x0);
      local_68.first.bucket_index_ = local_48.first.bucket_index_;
      local_68.first.node_ = local_48.first.node_;
      local_68.first.m_ = local_48.first.m_;
      local_68.second = local_48.second;
    }
    b = local_68.second;
    if (*(Arena **)((long)this + 0x28) == (Arena *)0x0) {
      node = (Node *)operator_new(0x48);
    }
    else {
      node = (Node *)Arena::AllocateAlignedWithHook
                               (*(Arena **)((long)this + 0x28),0x48,
                                (type_info *)&unsigned_char::typeinfo);
    }
    Arena::CreateInArenaStorage<std::__cxx11::string,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)node,
               *(Arena **)((long)this + 0x28),k);
    CoreML::Specification::CustomModel_CustomModelParamValue::CustomModel_CustomModelParamValue
              ((CustomModel_CustomModelParamValue *)&node->field_0x20,*(Arena **)((long)this + 0x28)
               ,false);
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
    ::InnerMap::InsertUnique(&__return_storage_ptr__->first,(InnerMap *)this,b,node);
    *(long *)this = *this + 1;
    bVar1 = true;
  }
  else {
    (__return_storage_ptr__->first).node_ = local_68.first.node_;
    (__return_storage_ptr__->first).m_ = local_68.first.m_;
    (__return_storage_ptr__->first).bucket_index_ = local_68.first.bucket_index_;
    bVar1 = false;
  }
  __return_storage_ptr__->second = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(K&& k) {
      std::pair<const_iterator, size_type> p = FindHelper(k);
      // Case 1: key was already present.
      if (p.first.node_ != nullptr)
        return std::make_pair(iterator(p.first), false);
      // Case 2: insert.
      if (ResizeIfLoadIsOutOfRange(num_elements_ + 1)) {
        p = FindHelper(k);
      }
      const size_type b = p.second;  // bucket number
      // If K is not key_type, make the conversion to key_type explicit.
      using TypeToInit = typename std::conditional<
          std::is_same<typename std::decay<K>::type, key_type>::value, K&&,
          key_type>::type;
      Node* node = Alloc<Node>(1);
      // Even when arena is nullptr, CreateInArenaStorage is still used to
      // ensure the arena of submessage will be consistent. Otherwise,
      // submessage may have its own arena when message-owned arena is enabled.
      Arena::CreateInArenaStorage(const_cast<Key*>(&node->kv.first),
                                  alloc_.arena(),
                                  static_cast<TypeToInit>(std::forward<K>(k)));
      Arena::CreateInArenaStorage(&node->kv.second, alloc_.arena());

      iterator result = InsertUnique(b, node);
      ++num_elements_;
      return std::make_pair(result, true);
    }